

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O3

void __thiscall QStyleSheetStyle::unsetStyleSheetFont(QStyleSheetStyle *this,QWidget *w)

{
  byte bVar1;
  Span *pSVar2;
  Entry *pEVar3;
  QWidget *this_00;
  ulong uVar4;
  long in_FS_OFFSET;
  iterator it;
  QWidget *local_70;
  QFont local_68 [16];
  undefined1 local_58 [16];
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_70 = w;
  it = QHash<QWidget_const*,QStyleSheetStyleCaches::Tampered<QFont>>::findImpl<QWidget_const*>
                 ((QHash<QWidget_const*,QStyleSheetStyleCaches::Tampered<QFont>> *)
                  &styleSheetCaches->customFontWidgets,&local_70);
  if (it.i.d != (Data<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>_>
                 *)0x0 || it.i.bucket != 0) {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    pSVar2 = (it.i.d)->spans;
    uVar4 = it.i.bucket >> 7;
    pEVar3 = pSVar2[uVar4].entries;
    bVar1 = pSVar2[uVar4].offsets[(uint)it.i.bucket & 0x7f];
    QFont::QFont((QFont *)&local_48,(QFont *)(pEVar3[bVar1].storage.data + 8));
    local_38 = (undefined1 *)
               CONCAT44(local_38._4_4_,*(undefined4 *)(pEVar3[bVar1].storage.data + 0x18));
    QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>::erase
              (&styleSheetCaches->customFontWidgets,(const_iterator)it.i);
    this_00 = local_70;
    QFont::QFont(local_68,&local_70->data->fnt);
    QStyleSheetStyleCaches::Tampered<QFont>::reverted
              ((Tampered<QFont> *)local_58,(QFont *)&local_48,local_68);
    QWidget::setFont(this_00,(QFont *)local_58);
    QFont::~QFont((QFont *)local_58);
    QFont::~QFont(local_68);
    QFont::~QFont((QFont *)&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStyleSheetStyle::unsetStyleSheetFont(QWidget *w) const
{
    const auto it = styleSheetCaches->customFontWidgets.find(w);
    if (it != styleSheetCaches->customFontWidgets.end()) {
        auto customizedFont = std::move(*it);
        styleSheetCaches->customFontWidgets.erase(it);
        w->setFont(std::move(customizedFont).reverted(w->font()));
    }
}